

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O2

void __thiscall duckdb::ARTMerger::MergeNodes(ARTMerger *this,NodeEntry *entry)

{
  uint8_t uVar1;
  idx_t iVar2;
  idx_t iVar3;
  unsafe_optional_ptr<Node> uVar4;
  reference pvVar5;
  Node __tmp;
  Node *pNVar6;
  size_type __n;
  ulong uVar7;
  NodeChildren children;
  vector<unsigned_long,_true> remaining;
  ulong local_78;
  size_type local_70;
  NodeChildren local_68;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  pNVar6 = entry->right;
  iVar2 = (entry->left->super_IndexPointer).data;
  iVar3 = (pNVar6->super_IndexPointer).data;
  if (((byte)(iVar2 >> 0x38) & 0x7f) < ((byte)(iVar3 >> 0x38) & 0x7f)) {
    (entry->left->super_IndexPointer).data = iVar3;
    (pNVar6->super_IndexPointer).data = iVar2;
    pNVar6 = entry->right;
  }
  ExtractChildren(&local_68,this,pNVar6);
  Node::Free(this->art,entry->right);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = 0;
  while( true ) {
    local_78 = uVar7;
    if (local_68.bytes.count <= uVar7) break;
    array_ptr<unsigned_char,_true>::AssertIndexInBounds(uVar7,local_68.bytes.count);
    uVar1 = local_68.bytes.ptr[uVar7];
    uVar4 = GetChildInternal<duckdb::Node_const>(this->art,entry->left,uVar1);
    uVar7 = local_78;
    if (uVar4.ptr == (Node *)0x0) {
      array_ptr<duckdb::Node,_true>::AssertIndexInBounds(local_78,local_68.children.count);
      Node::InsertChild(this->art,entry->left,uVar1,
                        (Node)local_68.children.ptr[uVar7].super_IndexPointer.data);
    }
    else {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,&local_78);
    }
    uVar7 = local_78 + 1;
  }
  __n = 0;
  while (__n < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_70 = __n;
    pvVar5 = vector<unsigned_long,_true>::get<true>((vector<unsigned_long,_true> *)&local_48,__n);
    iVar2 = *pvVar5;
    array_ptr<unsigned_char,_true>::AssertIndexInBounds(iVar2,local_68.bytes.count);
    uVar1 = local_68.bytes.ptr[iVar2];
    pvVar5 = vector<unsigned_long,_true>::get<true>
                       ((vector<unsigned_long,_true> *)&local_48,local_70);
    iVar2 = *pvVar5;
    array_ptr<duckdb::Node,_true>::AssertIndexInBounds(iVar2,local_68.children.count);
    pNVar6 = local_68.children.ptr;
    uVar4 = GetChildInternal<duckdb::Node_const>(this->art,entry->left,uVar1);
    Emplace(this,uVar4.ptr,pNVar6 + iVar2,entry->status,entry->depth + 1);
    __n = local_70 + 1;
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ARTMerger::MergeNodes(NodeEntry &entry) {
	D_ASSERT(entry.left.IsNode());
	D_ASSERT(entry.right.IsNode());

	// Merge the smaller node into the bigger node.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the children of the right node.
	// Then, copy them into left.
	auto children = ExtractChildren(entry.right);
	// As long as the arena is valid,
	// the copied-out nodes (and their references) are valid.
	Node::Free(art, entry.right);

	// First, we iterate and insert children.
	// This might grow the node, so we need to do it prior to Emplace.
	vector<idx_t> remaining;
	for (idx_t i = 0; i < children.bytes.size(); i++) {
		const auto byte = children.bytes[i];
		auto child = entry.left.GetChildMutable(art, byte);

		if (!child) {
			// There is no child at this byte.
			// We can insert the right node's child at byte and are done.
			auto &right_child = children.children[i];
			Node::InsertChild(art, entry.left, byte, right_child);
			continue;
		}
		// There is a left and a right child at this byte.
		// We remember to emplace the two children.
		remaining.emplace_back(i);
	}

	// Emplace all remaining children.
	for (idx_t i = 0; i < remaining.size(); i++) {
		const auto byte = children.bytes[remaining[i]];
		auto &right_child = children.children[remaining[i]];
		auto child = entry.left.GetChildMutable(art, byte);
		Emplace(*child, right_child, entry.status, entry.depth + 1);
	}
}